

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

int64_t Fixpp::impl::details::
        IndexesImpl<meta::pack::Pack<Fixpp::TagT<336U,_Fixpp::Type::String>_>_>::of_binary_search
                  (int tag)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = 0;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    uVar3 = uVar1;
    if (lVar4 < (long)uVar3) break;
    uVar1 = (ulong)(0x150 < tag);
    lVar2 = -(ulong)(tag < 0x151);
  } while (tag != 0x150);
  return -(ulong)(lVar4 < (long)uVar3);
}

Assistant:

static int64_t of_binary_search(int tag)
                {
                    int64_t low = 0;
                    int64_t high = Size - 1;
                    while (low <= high) {
                       auto mid = (low + high) / 2;
                       if (Sorted[mid] == tag) return mid;
                       else if (Sorted[mid] < tag) low = mid + 1;
                       else high = mid - 1;
                    }
                    return -1;
                }